

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this)

{
  bool bVar1;
  ResultBuilder *this_00;
  OfType OVar2;
  bool in_DL;
  string local_40;
  
  bVar1 = this->m_lhs;
  this_00 = this->m_rb;
  Catch::toString_abi_cxx11_(&local_40,(Catch *)(ulong)bVar1,in_DL);
  std::__cxx11::string::_M_assign((string *)&(this_00->m_exprComponents).lhs);
  OVar2 = ExpressionFailed;
  if (bVar1 != false) {
    OVar2 = Ok;
  }
  (this_00->m_data).resultType = OVar2;
  ResultBuilder::endExpression(this_00);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }